

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::CoverageMaskInvertCase::drawPattern
          (CoverageMaskInvertCase *this,bool invertSampleCoverage)

{
  GLenum err;
  deBool dVar1;
  float fVar2;
  float fVar3;
  Vector<float,_4> local_4c;
  Vector<float,_2> local_3c;
  Vector<float,_2> local_34;
  Vector<float,_2> local_2c;
  float local_24;
  float local_20;
  float angle1;
  float angle0;
  int i;
  int numTriangles;
  bool invertSampleCoverage_local;
  CoverageMaskInvertCase *this_local;
  
  angle0 = 3.50325e-44;
  i._3_1_ = invertSampleCoverage;
  _numTriangles = this;
  for (angle1 = 0.0; (int)angle1 < 0x19; angle1 = (float)((int)angle1 + 1)) {
    do {
      glwSampleCoverage((float)(int)angle1 / 24.0,(i._3_1_ & 1) != 0);
      err = glwGetError();
      glu::checkError(err,
                      "glSampleCoverage((float)i / (float)(numTriangles-1), invertSampleCoverage ? GL_TRUE : GL_FALSE)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                      ,0x614);
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    local_20 = ((float)(int)angle1 * 6.2831855) / 25.0;
    local_24 = (((float)(int)angle1 + 0.5) * 6.2831855) / 25.0;
    tcu::Vector<float,_2>::Vector(&local_2c,0.0,0.0);
    fVar2 = deFloatCos(local_20);
    fVar3 = deFloatSin(local_20);
    tcu::Vector<float,_2>::Vector(&local_34,fVar2 * 0.95,fVar3 * 0.95);
    fVar2 = deFloatCos(local_24);
    fVar3 = deFloatSin(local_24);
    tcu::Vector<float,_2>::Vector(&local_3c,fVar2 * 0.95,fVar3 * 0.95);
    tcu::Vector<float,_4>::Vector
              (&local_4c,((float)(int)angle1 / 25.0) * 0.6 + 0.4,
               ((float)(int)angle1 / 25.0) * 0.3 + 0.5,-((float)(int)angle1 / 25.0) * 0.5 + 0.6,
               -((float)(int)angle1 / 25.0) * 0.7 + 0.7);
    MultisampleCase::renderTriangle
              (&this->super_MultisampleCase,&local_2c,&local_34,&local_3c,&local_4c);
  }
  return;
}

Assistant:

void CoverageMaskInvertCase::drawPattern (bool invertSampleCoverage) const
{
	const int numTriangles = 25;
	for (int i = 0; i < numTriangles; i++)
	{
		GLU_CHECK_CALL(glSampleCoverage((float)i / (float)(numTriangles-1), invertSampleCoverage ? GL_TRUE : GL_FALSE));

		float angle0 = 2.0f*DE_PI * (float)i			/ (float)numTriangles;
		float angle1 = 2.0f*DE_PI * ((float)i + 0.5f)	/ (float)numTriangles;

		renderTriangle(Vec2(0.0f, 0.0f),
					   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
					   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
					   Vec4(0.4f + (float)i/(float)numTriangles*0.6f,
							0.5f + (float)i/(float)numTriangles*0.3f,
							0.6f - (float)i/(float)numTriangles*0.5f,
							0.7f - (float)i/(float)numTriangles*0.7f));
	}
}